

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O3

aint __thiscall CStructureEntry2::ParseValue(CStructureEntry2 *this,char **p)

{
  EStructureMembers EVar1;
  int iVar2;
  EType minType;
  bool bVar3;
  aint val;
  uint local_1c;
  
  if ((SMEMBD24 < this->type) || ((0x6cU >> (this->type & 0x1f) & 1) == 0)) {
    return this->def;
  }
  SkipBlanks(p);
  local_1c = this->def;
  if (**p == '{') {
    bVar3 = false;
  }
  else {
    iVar2 = ParseExpressionNoSyntaxError(p,(aint *)&local_1c);
    bVar3 = iVar2 != 0;
    if (!bVar3) {
      local_1c = this->def;
    }
    EVar1 = this->type;
    if (EVar1 == SMEMBD24) {
      check24(local_1c);
      local_1c = local_1c & 0xffffff;
    }
    else if (EVar1 == SMEMBWORD) {
      check16(local_1c);
      local_1c = local_1c & 0xffff;
    }
    else if (EVar1 == SMEMBBYTE) {
      check8(local_1c);
      local_1c = local_1c & 0xff;
    }
  }
  if (Relocation::type == 0) {
    return local_1c;
  }
  if (Relocation::type == 2 && this->type == SMEMBBYTE) {
    minType = HIGH;
  }
  else {
    if (this->type != SMEMBWORD) goto LAB_001327a0;
    minType = REGULAR;
  }
  if (!bVar3) {
    Relocation::deltaType = this->defDeltaType;
    Relocation::isResultAffected = Relocation::isResultAffected | Relocation::deltaType != OFF;
  }
  Relocation::resolveRelocationAffected(0,minType);
LAB_001327a0:
  Relocation::checkAndWarn(false);
  return local_1c;
}

Assistant:

aint CStructureEntry2::ParseValue(char* & p) {
	if (SMEMBBYTE != type && SMEMBWORD != type && SMEMBDWORD != type && SMEMBD24 != type) return def;
	SkipBlanks(p);
	aint val = def;
	bool keepRelocatableFlags = false;	// keep flags from the ParseExpressionNoSyntaxError?
	// check for unexpected {
	if ('{' != *p) {
		if (!(keepRelocatableFlags = ParseExpressionNoSyntaxError(p, val))) {
			val = def;
		}
		switch (type) {
			case SMEMBBYTE:
				check8(val);
				val &= 0xFF;
				break;
			case SMEMBWORD:
				check16(val);
				val &= 0xFFFF;
				break;
			case SMEMBD24:
				check24(val);
				val &= 0xFFFFFF;
				break;
			case SMEMBDWORD:
				break;
			default:
				break;
		}
	}
	if (!Relocation::type) return val;
	if (SMEMBBYTE == type && Relocation::HIGH == Relocation::type) {
		if (!keepRelocatableFlags) {	// override flags, if parse expression was not successful
			Relocation::isResultAffected |= bool(defDeltaType);
			Relocation::deltaType = defDeltaType;
		}
		Relocation::resolveRelocationAffected(0, Relocation::HIGH);
	} else if (SMEMBWORD == type) {
		if (!keepRelocatableFlags) {	// override flags, if parse expression was not successful
			Relocation::isResultAffected |= bool(defDeltaType);
			Relocation::deltaType = defDeltaType;
		}
		Relocation::resolveRelocationAffected(0);
	}
	Relocation::checkAndWarn();
	return val;
}